

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ReferenceRenderTimeCase::runSample
          (ReferenceRenderTimeCase *this,SampleResult *sample)

{
  int iVar1;
  int iVar2;
  DrawMethod DVar3;
  RenderContext *context;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar7;
  undefined4 extraout_var_01;
  deUint64 dVar8;
  deUint64 dVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  Surface resultSurface;
  Buffer indexBuffer;
  Buffer arrayBuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_c8;
  Surface local_a8;
  TextureFormat local_90;
  ObjectWrapper local_88;
  ObjectWrapper local_70;
  PixelBufferAccess local_58;
  long lVar6;
  
  iVar4 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
             super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  tcu::Surface::Surface(&local_a8,0x80,0x80);
  iVar4 = (sample->scene).gridWidth;
  iVar1 = (sample->scene).gridHeight;
  iVar2 = (sample->scene).gridLayers;
  iVar5 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
             super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_70,(Functions *)CONCAT44(extraout_var_00,iVar5),pOVar7);
  iVar5 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
             super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_88,(Functions *)CONCAT44(extraout_var_01,iVar5),pOVar7);
  local_c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  generateLayeredGridVertexAttribData4C4V(&local_c8,&sample->scene);
  (**(code **)(lVar6 + 0x40))(0x8892,local_70.m_object);
  (**(code **)(lVar6 + 0x150))
            (0x8892,(long)((int)local_c8.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_c8.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             local_c8.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  if ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    generateLayeredGridIndexData(&local_e8,&sample->scene);
    (**(code **)(lVar6 + 0x40))(0x8893,local_88.m_object);
    (**(code **)(lVar6 + 0x150))
              (0x8893,(long)((int)local_e8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (int)local_e8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffc,
               local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
  }
  RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  iVar4 = iVar4 * iVar1 * iVar2 * 6;
  DVar3 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
          m_drawMethod;
  if (DVar3 == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar6 + 0x568))(4,iVar4,0x1405,0);
  }
  else if (DVar3 == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar6 + 0x538))(4,0,iVar4);
  }
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  (**(code **)(lVar6 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar6 + 0x188))(0x4000);
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  tcu::warmupCPU();
  dVar8 = deGetMicroseconds();
  DVar3 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
          m_drawMethod;
  if (DVar3 == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar6 + 0x568))(4,iVar4,0x1405,0);
  }
  else if (DVar3 == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar6 + 0x538))(4,0,iVar4);
  }
  dVar9 = deGetMicroseconds();
  (sample->result).duration.renderDuration = dVar9 - dVar8;
  dVar8 = deGetMicroseconds();
  context = ((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
             super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx;
  local_90.order = RGBA;
  local_90.type = UNORM_INT8;
  if ((void *)local_a8.m_pixels.m_cap != (void *)0x0) {
    local_a8.m_pixels.m_cap = (size_t)local_a8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_90,local_a8.m_width,local_a8.m_height,1,
             (void *)local_a8.m_pixels.m_cap);
  glu::readPixels(context,0,0,&local_58);
  dVar9 = deGetMicroseconds();
  (sample->result).duration.readDuration = dVar9 - dVar8;
  (sample->result).renderDataSize = (sample->result).numVertices << 5;
  (sample->result).uploadedDataSize = 0;
  (sample->result).unrelatedDataSize = 0;
  dVar8 = (dVar9 - dVar8) + (sample->result).duration.renderDuration;
  (sample->result).duration.renderReadDuration = dVar8;
  (sample->result).duration.totalDuration = dVar8;
  (sample->result).duration.fitResponseDuration = dVar8;
  if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_88);
  glu::ObjectWrapper::~ObjectWrapper(&local_70);
  tcu::Surface::~Surface(&local_a8);
  return;
}

Assistant:

void ReferenceRenderTimeCase::runSample (SampleResult& sample)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultSurface	(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	const int				numVertices		= getLayeredGridNumVertices(sample.scene);
	const glu::Buffer		arrayBuffer		(m_context.getRenderContext());
	const glu::Buffer		indexBuffer		(m_context.getRenderContext());
	std::vector<tcu::Vec4>	vertexData;
	std::vector<deUint32>	indexData;
	deUint64				startTime;
	deUint64				endTime;

	// generate and upload buffers

	generateLayeredGridVertexAttribData4C4V(vertexData, sample.scene);
	gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STATIC_DRAW);

	if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
	{
		generateLayeredGridIndexData(indexData, sample.scene);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STATIC_DRAW);
	}

	setupVertexAttribs();

	// make sure data is uploaded

	if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
	else
		DE_ASSERT(false);
	waitGLResults();

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	waitGLResults();

	tcu::warmupCPU();

	// Measure both draw and associated readpixels
	{
		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.renderDuration = endTime - startTime;
	}

	{
		startTime = deGetMicroseconds();
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
		endTime = deGetMicroseconds();

		sample.result.duration.readDuration = endTime - startTime;
	}

	sample.result.renderDataSize = getVertexDataSize() * sample.result.numVertices;
	sample.result.uploadedDataSize = 0;
	sample.result.unrelatedDataSize = 0;
	sample.result.duration.renderReadDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.totalDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.fitResponseDuration = sample.result.duration.renderReadDuration;
}